

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_set_implemented(lys_module *module)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ly_ctx *plVar4;
  lys_module *plVar5;
  lys_node *node;
  int iVar6;
  LYS_NODE LVar7;
  lys_node *snode;
  lys_node *plVar8;
  lys_node *plVar9;
  LY_ERR *pLVar10;
  lys_include *plVar11;
  lys_submodule *plVar12;
  long lVar13;
  lys_module *plVar14;
  ulong uVar15;
  lys_node *plVar16;
  ulong uVar17;
  long lVar18;
  lys_node **pplVar19;
  unres_schema *local_50;
  unres_schema *unres;
  lys_module *local_40;
  byte local_31;
  
  if (module == (lys_module *)0x0) {
    pLVar10 = ly_errno_location();
    *pLVar10 = LY_EINVAL;
LAB_00154d85:
    iVar6 = 1;
  }
  else {
    bVar1 = module->field_0x40;
    if ((bVar1 & 1) != 0) {
      module = (lys_module *)module->data;
      bVar1 = module->field_0x40;
    }
    local_40 = module;
    bVar2 = bVar1;
    if ((bVar1 & 0x40) != 0) {
      lys_set_enabled(module);
      bVar2 = local_40->field_0x40;
    }
    if (-1 < (char)bVar2) {
      plVar4 = local_40->ctx;
      uVar3 = (plVar4->models).used;
      uVar15 = 0;
      plVar14 = local_40;
      uVar17 = (ulong)uVar3;
      local_31 = bVar1;
      if ((int)uVar3 < 1) {
        uVar17 = uVar15;
      }
      for (; uVar17 != uVar15; uVar15 = uVar15 + 1) {
        plVar5 = (plVar4->models).list[uVar15];
        if (((plVar14 != plVar5) &&
            (iVar6 = strcmp(local_40->name,plVar5->name), plVar14 = local_40, iVar6 == 0)) &&
           ((char)plVar5->field_0x40 < '\0')) {
          pLVar10 = ly_errno_location();
          *pLVar10 = LY_EINVAL;
          ly_log(LY_LLERR,"Module \"%s\" in another revision already implemented.",plVar14->name);
          goto joined_r0x00154cbd;
        }
      }
      local_50 = (unres_schema *)calloc(1,0x28);
      unres = local_50;
      if (local_50 == (unres_schema *)0x0) {
        pLVar10 = ly_errno_location();
        *pLVar10 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_set_implemented");
        plVar14 = local_40;
joined_r0x00154cbd:
        if ((local_31 & 0x40) == 0) {
          return 1;
        }
        lys_set_disabled(plVar14);
        return 1;
      }
      local_40->field_0x40 = bVar2 | 0x80;
      lVar13 = 0;
      plVar14 = local_40;
      for (uVar17 = 0; uVar17 < plVar14->augment_size; uVar17 = uVar17 + 1) {
        if ((*(long *)(plVar14->augment->padding + lVar13 + 0x3c) == 0) &&
           (iVar6 = unres_schema_add_node
                              (local_40,unres,plVar14->augment->padding + lVar13 + -0x1c,
                               UNRES_AUGMENT,(lys_node *)0x0), plVar14 = local_40, iVar6 == -1))
        goto LAB_00154d65;
        lVar13 = lVar13 + 0x68;
      }
      pplVar19 = &plVar14->data;
      while (node = *pplVar19, plVar16 = node, node != (lys_node *)0x0) {
LAB_00154b9f:
        snode = plVar16;
        if (snode != (lys_node *)0x0) {
          LVar7 = snode->nodetype;
          if (LVar7 != LYS_GROUPING) {
            if (((LVar7 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
               (iVar6._0_2_ = snode[1].flags, iVar6._2_1_ = snode[1].ext_size,
               iVar6._3_1_ = snode[1].iffeature_size, iVar6 == 9)) {
              iVar6 = unres_schema_add_node(local_40,unres,&snode[1].ref,UNRES_TYPE_LEAFREF,snode);
              if (iVar6 == -1) goto LAB_00154d65;
              LVar7 = snode->nodetype;
              plVar14 = local_40;
            }
            plVar16 = snode->child;
            if (plVar16 != (lys_node *)0x0 &&
                (LVar7 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) goto LAB_00154c19;
          }
          if (snode == node) goto LAB_00154c54;
          do {
            plVar16 = snode->next;
LAB_00154c19:
            if (plVar16 != (lys_node *)0x0) break;
            snode = lys_parent(snode);
            plVar8 = lys_parent(snode);
            plVar9 = lys_parent(node);
            plVar14 = local_40;
          } while (plVar8 != plVar9);
          goto LAB_00154b9f;
        }
LAB_00154c54:
        pplVar19 = &node->next;
      }
      for (uVar17 = 0; uVar17 < plVar14->inc_size; uVar17 = uVar17 + 1) {
        plVar11 = plVar14->inc;
        plVar12 = plVar11[uVar17].submodule;
        if (plVar12 == (lys_submodule *)0x0) break;
        lVar13 = 0;
        lVar18 = 0;
        for (uVar15 = 0; uVar15 < plVar12->augment_size; uVar15 = uVar15 + 1) {
          if (*(long *)(plVar12->augment->padding + lVar13 + 0x3c) == 0) {
            iVar6 = unres_schema_add_node
                              (*(lys_module **)(plVar11->rev + lVar18 + -8),unres,
                               plVar12->augment->padding + lVar13 + -0x1c,UNRES_AUGMENT,
                               (lys_node *)0x0);
            if (iVar6 == -1) goto LAB_00154d65;
            plVar11 = local_40->inc;
            plVar12 = plVar11[uVar17].submodule;
            plVar14 = local_40;
          }
          lVar18 = lVar18 + 0x30;
          lVar13 = lVar13 + 0x68;
        }
      }
      if ((unres->count != 0) &&
         (iVar6 = resolve_unres_schema(local_40,unres), plVar14 = local_40, iVar6 != 0)) {
LAB_00154d65:
        if ((local_31 & 0x40) != 0) {
          lys_set_disabled(local_40);
        }
        local_40->field_0x40 = local_40->field_0x40 & 0x7f;
        unres_schema_free(local_40,&local_50);
        goto LAB_00154d85;
      }
      unres_schema_free(plVar14,&local_50);
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

API int
lys_set_implemented(const struct lys_module *module)
{
    struct ly_ctx *ctx;
    struct unres_schema *unres;
    int i, j, disabled = 0;

    if (!module) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    module = lys_main_module(module);

    if (module->disabled) {
        disabled = 1;
        lys_set_enabled(module);
    }

    if (module->implemented) {
        return EXIT_SUCCESS;
    }

    ctx = module->ctx;

    for (i = 0; i < ctx->models.used; ++i) {
        if (module == ctx->models.list[i]) {
            continue;
        }

        if (!strcmp(module->name, ctx->models.list[i]->name) && ctx->models.list[i]->implemented) {
            LOGERR(LY_EINVAL, "Module \"%s\" in another revision already implemented.", module->name);
            if (disabled) {
                /* set it back disabled */
                lys_set_disabled(module);
            }
            return EXIT_FAILURE;
        }
    }

    unres = calloc(1, sizeof *unres);
    if (!unres) {
        LOGMEM;
        if (disabled) {
            /* set it back disabled */
            lys_set_disabled(module);
        }
        return EXIT_FAILURE;
    }
    /* recursively make the module implemented */
    ((struct lys_module *)module)->implemented = 1;
    if (lys_set_implemented_recursion((struct lys_module *)module, unres)) {
        goto error;
    }
    /* process augments in submodules */
    for (i = 0; i < module->inc_size && module->inc[i].submodule; ++i) {
        for (j = 0; j < module->inc[i].submodule->augment_size; j++) {
            /* apply augment */
            if (!module->inc[i].submodule->augment[j].target
                    && (unres_schema_add_node((struct lys_module *)module->inc[j].submodule, unres,
                                              &module->inc[i].submodule->augment[j], UNRES_AUGMENT, NULL) == -1)) {

                goto error;
            }
        }
    }
    /* try again resolve augments in other modules possibly augmenting this one,
     * since we have just enabled it
     */
    /* resolve rest of unres items */
    if (unres->count && resolve_unres_schema((struct lys_module *)module, unres)) {
        goto error;
    }
    unres_schema_free((struct lys_module *)module, &unres);

    return EXIT_SUCCESS;

error:

    if (disabled) {
        /* set it back disabled */
        lys_set_disabled(module);
    }

    ((struct lys_module *)module)->implemented = 0;
    unres_schema_free((struct lys_module *)module, &unres);
    return EXIT_FAILURE;
}